

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1gload.c
# Opt level: O0

FT_Error T1_Parse_Glyph_And_Get_Char_String
                   (T1_Decoder_conflict decoder,FT_UInt glyph_index,FT_Data *char_string,
                   FT_Bool *force_scaling)

{
  FT_Face pFVar1;
  FT_String *pFVar2;
  FT_Incremental_InterfaceRec *pFVar3;
  FT_Fixed FVar4;
  undefined1 local_a30 [8];
  FT_Incremental_MetricsRec metrics;
  CFF_SubFontRec subfont;
  FT_Incremental_InterfaceRec *inc;
  PS_Decoder psdecoder;
  T1_Decoder_Funcs decoder_funcs;
  PSAux_Service psaux;
  FT_Error error;
  T1_Font type1;
  T1_Face face;
  FT_Bool *force_scaling_local;
  FT_Data *char_string_local;
  FT_UInt glyph_index_local;
  T1_Decoder_conflict decoder_local;
  
  pFVar1 = (decoder->builder).face;
  psaux._4_4_ = 0;
  pFVar2 = pFVar1[3].family_name;
  psdecoder._1256_8_ = *(undefined8 *)(pFVar2 + 0x18);
  pFVar3 = pFVar1->internal->incremental_interface;
  (decoder->font_matrix).xx = (FT_Fixed)pFVar1[2].memory;
  (decoder->font_matrix).xy = (FT_Fixed)pFVar1[2].stream;
  (decoder->font_matrix).yx = (FT_Fixed)pFVar1[2].sizes_list.head;
  (decoder->font_matrix).yy = (FT_Fixed)pFVar1[2].sizes_list.tail;
  (decoder->font_offset).x = (FT_Pos)pFVar1[2].autohint.data;
  (decoder->font_offset).y = (FT_Pos)pFVar1[2].autohint.finalizer;
  if (pFVar3 == (FT_Incremental_InterfaceRec *)0x0) {
    char_string->pointer = (FT_Byte *)(&(pFVar1[2].size)->face)[glyph_index];
    char_string->length = *(FT_UInt *)((long)&(pFVar1[2].charmap)->face + (ulong)glyph_index * 4);
  }
  else {
    psaux._4_4_ = (*pFVar3->funcs->get_glyph_data)(pFVar3->object,glyph_index,char_string);
  }
  if (psaux._4_4_ == 0) {
    if ((decoder->builder).metrics_only == '\0') {
      (**(code **)(pFVar2 + 0x30))(&inc,decoder,1);
      (**(code **)(pFVar2 + 0x38))(pFVar1,&pFVar1[1].available_sizes,&metrics.advance_v);
      psdecoder.cff = (CFF_Font_conflict)&metrics.advance_v;
      psaux._4_4_ = (**(code **)(psdecoder._1256_8_ + 0x18))
                              (&inc,char_string->pointer,char_string->length);
      if ((psaux._4_4_ & 0xff) == 0xa4) {
        *(undefined1 *)&(decoder->builder).glyph[1].library = 0;
        *force_scaling = '\x01';
        psaux._4_4_ = (**(code **)(psdecoder._1256_8_ + 0x18))
                                (&inc,char_string->pointer,char_string->length);
      }
    }
    else {
      psaux._4_4_ = (**(code **)(psdecoder._1256_8_ + 0x10))
                              (decoder,char_string->pointer,char_string->length);
    }
  }
  if (((psaux._4_4_ == 0) && (pFVar3 != (FT_Incremental_InterfaceRec *)0x0)) &&
     (pFVar3->funcs->get_glyph_metrics != (FT_Incremental_GetGlyphMetricsFunc)0x0)) {
    FVar4 = FT_RoundFix((decoder->builder).left_bearing.x);
    local_a30 = (undefined1  [8])(FVar4 >> 0x10);
    metrics.bearing_x = 0;
    FVar4 = FT_RoundFix((decoder->builder).advance.x);
    metrics.bearing_y = FVar4 >> 0x10;
    FVar4 = FT_RoundFix((decoder->builder).advance.y);
    metrics.advance = FVar4 >> 0x10;
    psaux._4_4_ = (*pFVar3->funcs->get_glyph_metrics)
                            (pFVar3->object,glyph_index,'\0',(FT_Incremental_MetricsRec *)local_a30)
    ;
    (decoder->builder).left_bearing.x = (long)local_a30 << 0x10;
    (decoder->builder).advance.x = metrics.bearing_y << 0x10;
    (decoder->builder).advance.y = metrics.advance << 0x10;
  }
  return psaux._4_4_;
}

Assistant:

static FT_Error
  T1_Parse_Glyph_And_Get_Char_String( T1_Decoder  decoder,
                                      FT_UInt     glyph_index,
                                      FT_Data*    char_string,
                                      FT_Bool*    force_scaling )
  {
    T1_Face   face  = (T1_Face)decoder->builder.face;
    T1_Font   type1 = &face->type1;
    FT_Error  error = FT_Err_Ok;

    PSAux_Service           psaux         = (PSAux_Service)face->psaux;
    const T1_Decoder_Funcs  decoder_funcs = psaux->t1_decoder_funcs;
    PS_Decoder              psdecoder;

#ifdef FT_CONFIG_OPTION_INCREMENTAL
    FT_Incremental_InterfaceRec *inc =
                      face->root.internal->incremental_interface;
#endif

#ifdef T1_CONFIG_OPTION_OLD_ENGINE
    PS_Driver  driver = (PS_Driver)FT_FACE_DRIVER( face );
#endif


    decoder->font_matrix = type1->font_matrix;
    decoder->font_offset = type1->font_offset;

#ifdef FT_CONFIG_OPTION_INCREMENTAL

    /* For incremental fonts get the character data using the */
    /* callback function.                                     */
    if ( inc )
      error = inc->funcs->get_glyph_data( inc->object,
                                          glyph_index, char_string );
    else

#endif /* FT_CONFIG_OPTION_INCREMENTAL */

    /* For ordinary fonts get the character data stored in the face record. */
    {
      char_string->pointer = type1->charstrings[glyph_index];
      char_string->length  = type1->charstrings_len[glyph_index];
    }

    if ( !error )
    {
      /* choose which renderer to use */
#ifdef T1_CONFIG_OPTION_OLD_ENGINE
      if ( driver->hinting_engine == FT_HINTING_FREETYPE ||
           decoder->builder.metrics_only                 )
        error = decoder_funcs->parse_charstrings_old(
                  decoder,
                  (FT_Byte*)char_string->pointer,
                  (FT_UInt)char_string->length );
#else
      if ( decoder->builder.metrics_only )
        error = decoder_funcs->parse_metrics(
                  decoder,
                  (FT_Byte*)char_string->pointer,
                  (FT_UInt)char_string->length );
#endif
      else
      {
        CFF_SubFontRec  subfont;


        psaux->ps_decoder_init( &psdecoder, decoder, TRUE );

        psaux->t1_make_subfont( FT_FACE( face ),
                                &face->type1.private_dict, &subfont );
        psdecoder.current_subfont = &subfont;

        error = decoder_funcs->parse_charstrings(
                  &psdecoder,
                  (FT_Byte*)char_string->pointer,
                  (FT_ULong)char_string->length );

        /* Adobe's engine uses 16.16 numbers everywhere;              */
        /* as a consequence, glyphs larger than 2000ppem get rejected */
        if ( FT_ERR_EQ( error, Glyph_Too_Big ) )
        {
          /* this time, we retry unhinted and scale up the glyph later on */
          /* (the engine uses and sets the hardcoded value 0x10000 / 64 = */
          /* 0x400 for both `x_scale' and `y_scale' in this case)         */
          ((T1_GlyphSlot)decoder->builder.glyph)->hint = FALSE;

          *force_scaling = TRUE;

          error = decoder_funcs->parse_charstrings(
                    &psdecoder,
                    (FT_Byte*)char_string->pointer,
                    (FT_ULong)char_string->length );
        }
      }
    }

#ifdef FT_CONFIG_OPTION_INCREMENTAL

    /* Incremental fonts can optionally override the metrics. */
    if ( !error && inc && inc->funcs->get_glyph_metrics )
    {
      FT_Incremental_MetricsRec  metrics;


      metrics.bearing_x = FIXED_TO_INT( decoder->builder.left_bearing.x );
      metrics.bearing_y = 0;
      metrics.advance   = FIXED_TO_INT( decoder->builder.advance.x );
      metrics.advance_v = FIXED_TO_INT( decoder->builder.advance.y );

      error = inc->funcs->get_glyph_metrics( inc->object,
                                             glyph_index, FALSE, &metrics );

      decoder->builder.left_bearing.x = INT_TO_FIXED( metrics.bearing_x );
      decoder->builder.advance.x      = INT_TO_FIXED( metrics.advance );
      decoder->builder.advance.y      = INT_TO_FIXED( metrics.advance_v );
    }

#endif /* FT_CONFIG_OPTION_INCREMENTAL */

    return error;
  }